

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeConcepts.hh
# Opt level: O0

void __thiscall
avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>::add
          (NoAttribute<boost::shared_ptr<avro::Node>_> *this,shared_ptr<avro::Node> *attr)

{
  string *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Exception *this_00;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  msg = (string *)__cxa_allocate_exception(0x18);
  this_00 = (Exception *)&stack0xffffffffffffffcf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  Exception::Exception(this_00,msg);
  __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void add( const Attribute &attr) {
        // There must be an add function for the generic NodeImpl, but the
        // Node APIs ensure that it is never called, the throw here is
        // just in case
        throw Exception("This type does not have attribute");
    }